

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int compression_init_encoder_lzma(archive *a,la_zstream *lastrm,int level,uint64_t filter_id)

{
  int error_number;
  lzma_bool lVar1;
  lzma_ret lVar2;
  lzma_stream *strm;
  uint8_t *props;
  char *fmt;
  uint32_t preset;
  ulong __size;
  lzma_stream *filter;
  lzma_options_lzma lzma_opt;
  
  if (lastrm->valid != 0) {
    compression_end(a,lastrm);
  }
  strm = (lzma_stream *)calloc(1,0xa8);
  if (strm == (lzma_stream *)0x0) {
    fmt = "Can\'t allocate memory for lzma stream";
  }
  else {
    preset = 6;
    if (level < 6) {
      preset = level;
    }
    lVar1 = lzma_lzma_preset(&lzma_opt,preset);
    if (lVar1 == '\0') {
      filter = strm + 1;
      strm[1].next_in = (uint8_t *)filter_id;
      strm[1].avail_in = (size_t)&lzma_opt;
      strm[1].total_in = 0xffffffffffffffff;
      lVar2 = lzma_properties_size(&lastrm->prop_size,(lzma_filter *)filter);
      if (lVar2 == LZMA_OK) {
        __size = (ulong)lastrm->prop_size;
        if (__size != 0) {
          props = (uint8_t *)malloc(__size);
          lastrm->props = props;
          if (props == (uint8_t *)0x0) {
            free(strm);
            lastrm->real_stream = (void *)0x0;
            fmt = "Cannot allocate memory";
            goto LAB_005440fb;
          }
          lVar2 = lzma_properties_encode((lzma_filter *)filter,props);
          if (lVar2 != LZMA_OK) {
            free(strm);
            lastrm->real_stream = (void *)0x0;
            fmt = "lzma_properties_encode failed";
            goto LAB_00544161;
          }
        }
        memset(strm,0,0x88);
        lVar2 = lzma_raw_encoder(strm,(lzma_filter *)filter);
        if (lVar2 == LZMA_MEM_ERROR) {
          free(strm);
          lastrm->real_stream = (void *)0x0;
          fmt = "Internal error initializing compression library: Cannot allocate memory";
          goto LAB_005440fb;
        }
        if (lVar2 == LZMA_OK) {
          lastrm->real_stream = strm;
          lastrm->valid = 1;
          lastrm->code = compression_code_lzma;
          lastrm->end = compression_end_lzma;
          return 0;
        }
        free(strm);
        lastrm->real_stream = (void *)0x0;
        fmt = "Internal error initializing compression library: It\'s a bug in liblzma";
      }
      else {
        free(strm);
        lastrm->real_stream = (void *)0x0;
        fmt = "lzma_properties_size failed";
      }
LAB_00544161:
      error_number = -1;
      goto LAB_005440fd;
    }
    free(strm);
    lastrm->real_stream = (void *)0x0;
    fmt = "Internal error initializing compression library";
  }
LAB_005440fb:
  error_number = 0xc;
LAB_005440fd:
  archive_set_error(a,error_number,fmt);
  return -0x1e;
}

Assistant:

static int
compression_init_encoder_lzma(struct archive *a,
    struct la_zstream *lastrm, int level, uint64_t filter_id)
{
	static const lzma_stream lzma_init_data = LZMA_STREAM_INIT;
	lzma_stream *strm;
	lzma_filter *lzmafilters;
	lzma_options_lzma lzma_opt;
	int r;

	if (lastrm->valid)
		compression_end(a, lastrm);
	strm = calloc(1, sizeof(*strm) + sizeof(*lzmafilters) * 2);
	if (strm == NULL) {
		archive_set_error(a, ENOMEM,
		    "Can't allocate memory for lzma stream");
		return (ARCHIVE_FATAL);
	}
	lzmafilters = (lzma_filter *)(strm+1);
	if (level > 6)
		level = 6;
	if (lzma_lzma_preset(&lzma_opt, level)) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library");
		return (ARCHIVE_FATAL);
	}
	lzmafilters[0].id = filter_id;
	lzmafilters[0].options = &lzma_opt;
	lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */

	r = lzma_properties_size(&(lastrm->prop_size), lzmafilters);
	if (r != LZMA_OK) {
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "lzma_properties_size failed");
		return (ARCHIVE_FATAL);
	}
	if (lastrm->prop_size) {
		lastrm->props = malloc(lastrm->prop_size);
		if (lastrm->props == NULL) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ENOMEM,
			    "Cannot allocate memory");
			return (ARCHIVE_FATAL);
		}
		r = lzma_properties_encode(lzmafilters,  lastrm->props);
		if (r != LZMA_OK) {
			free(strm);
			lastrm->real_stream = NULL;
			archive_set_error(a, ARCHIVE_ERRNO_MISC,
			    "lzma_properties_encode failed");
			return (ARCHIVE_FATAL);
		}
	}

	*strm = lzma_init_data;
	r = lzma_raw_encoder(strm, lzmafilters);
	switch (r) {
	case LZMA_OK:
		lastrm->real_stream = strm;
		lastrm->valid = 1;
		lastrm->code = compression_code_lzma;
		lastrm->end = compression_end_lzma;
		r = ARCHIVE_OK;
		break;
	case LZMA_MEM_ERROR:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ENOMEM,
		    "Internal error initializing compression library: "
		    "Cannot allocate memory");
		r =  ARCHIVE_FATAL;
		break;
        default:
		free(strm);
		lastrm->real_stream = NULL;
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Internal error initializing compression library: "
		    "It's a bug in liblzma");
		r =  ARCHIVE_FATAL;
		break;
	}
	return (r);
}